

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall
cmSourceFile::StoreProperty<char_const*>(cmSourceFile *this,string *prop,char *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __type _Var1;
  undefined1 local_60 [8];
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  undefined1 local_30 [8];
  cmListFileBacktrace lfbt;
  char *value_local;
  string *prop_local;
  cmSourceFile *this_local;
  
  lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  _Var1 = std::operator==(prop,&propINCLUDE_DIRECTORIES_abi_cxx11_);
  if (_Var1) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->IncludeDirectories);
    if (lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cmSourceFileLocation::GetMakefile(&this->Location);
      cmMakefile::GetBacktrace((cmMakefile *)local_30);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<char_const*&,cmListFileBacktrace&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &this->IncludeDirectories,
                 (char **)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,(cmListFileBacktrace *)local_30);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
    }
  }
  else {
    _Var1 = std::operator==(prop,&propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var1) {
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&this->CompileOptions);
      if (lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        cmSourceFileLocation::GetMakefile(&this->Location);
        this_00 = &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
        cmMakefile::GetBacktrace((cmMakefile *)this_00);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<char_const*&,cmListFileBacktrace&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   &this->CompileOptions,
                   (char **)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(cmListFileBacktrace *)this_00);
        cmListFileBacktrace::~cmListFileBacktrace
                  ((cmListFileBacktrace *)
                   &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    else {
      _Var1 = std::operator==(prop,&propCOMPILE_DEFINITIONS_abi_cxx11_);
      if (_Var1) {
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&this->CompileDefinitions);
        if (lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          cmSourceFileLocation::GetMakefile(&this->Location);
          cmMakefile::GetBacktrace((cmMakefile *)local_60);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<char_const*&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &this->CompileDefinitions,
                     (char **)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                               TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,(cmListFileBacktrace *)local_60);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_60);
        }
      }
      else {
        cmPropertyMap::SetProperty
                  (&this->Properties,prop,
                   (char *)lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
      }
    }
  }
  return;
}

Assistant:

void cmSourceFile::StoreProperty(const std::string& prop, ValueType value)
{
  if (prop == propINCLUDE_DIRECTORIES) {
    this->IncludeDirectories.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->IncludeDirectories.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->CompileOptions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileOptions.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->CompileDefinitions.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->Location.GetMakefile()->GetBacktrace();
      this->CompileDefinitions.emplace_back(value, lfbt);
    }
  } else {
    this->Properties.SetProperty(prop, value);
  }
}